

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall
QPDFWriter::setEncryptionParameters
          (QPDFWriter *this,char *user_password,char *owner_password,int V,int R,int key_len,
          set<int,_std::less<int>,_std::allocator<int>_> *bits_to_clear)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *user_password_00;
  bool bVar6;
  reference piVar7;
  element_type *peVar8;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar9;
  allocator<char> local_179;
  string local_178;
  undefined1 local_148 [8];
  string encryption_key;
  string Perms;
  string UE;
  string OE;
  string U;
  string O;
  iterator iStack_80;
  int b;
  iterator __end1;
  iterator __begin1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range1;
  int P;
  undefined1 local_58;
  value_type_conflict3 local_4c;
  _Base_ptr local_48;
  undefined1 local_40;
  value_type_conflict3 local_38;
  int local_34;
  int local_30;
  int key_len_local;
  int R_local;
  int V_local;
  char *owner_password_local;
  char *user_password_local;
  QPDFWriter *this_local;
  
  local_38 = 1;
  local_34 = key_len;
  local_30 = R;
  key_len_local = V;
  _R_local = owner_password;
  owner_password_local = user_password;
  user_password_local = (char *)this;
  pVar9 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert(bits_to_clear,&local_38);
  local_48 = (_Base_ptr)pVar9.first._M_node;
  local_40 = pVar9.second;
  local_4c = 2;
  pVar9 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert(bits_to_clear,&local_4c);
  _P = pVar9.first._M_node;
  local_58 = pVar9.second;
  if (3 < local_30) {
    __range1._4_4_ = 10;
    std::set<int,_std::less<int>,_std::allocator<int>_>::erase
              (bits_to_clear,(key_type *)((long)&__range1 + 4));
  }
  __range1._0_4_ = 0;
  __end1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(bits_to_clear);
  iStack_80 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(bits_to_clear);
  while( true ) {
    bVar6 = std::operator!=(&__end1,&stack0xffffffffffffff80);
    if (!bVar6) break;
    piVar7 = std::_Rb_tree_const_iterator<int>::operator*(&__end1);
    __range1._0_4_ = 1 << ((char)*piVar7 - 1U & 0x1f) | (uint)__range1;
    std::_Rb_tree_const_iterator<int>::operator++(&__end1);
  }
  __range1._0_4_ = (uint)__range1 ^ 0xffffffff;
  generateID(this);
  std::__cxx11::string::string((string *)(U.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(OE.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(UE.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(Perms.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(encryption_key.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_148);
  user_password_00 = owner_password_local;
  pcVar5 = _R_local;
  iVar4 = key_len_local;
  iVar3 = local_30;
  iVar2 = local_34;
  uVar1 = (uint)__range1;
  if (key_len_local < 5) {
    peVar8 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    bVar6 = peVar8->encrypt_metadata;
    peVar8 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    QPDF::compute_encryption_O_U
              (user_password_00,pcVar5,iVar4,iVar3,iVar2,uVar1,(bool)(bVar6 & 1),&peVar8->id1,
               (string *)((long)&U.field_2 + 8),(string *)((long)&OE.field_2 + 8));
  }
  else {
    peVar8 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    bVar6 = peVar8->encrypt_metadata;
    peVar8 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    QPDF::compute_encryption_parameters_V5
              (user_password_00,pcVar5,iVar4,iVar3,iVar2,uVar1,(bool)(bVar6 & 1),&peVar8->id1,
               (string *)local_148,(string *)((long)&U.field_2 + 8),
               (string *)((long)&OE.field_2 + 8),(string *)((long)&UE.field_2 + 8),
               (string *)((long)&Perms.field_2 + 8),(string *)((long)&encryption_key.field_2 + 8));
  }
  iVar4 = key_len_local;
  iVar3 = local_30;
  iVar2 = local_34;
  uVar1 = (uint)__range1;
  peVar8 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  pcVar5 = owner_password_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,pcVar5,&local_179);
  setEncryptionParametersInternal
            (this,iVar4,iVar3,iVar2,uVar1,(string *)((long)&U.field_2 + 8),
             (string *)((long)&OE.field_2 + 8),(string *)((long)&UE.field_2 + 8),
             (string *)((long)&Perms.field_2 + 8),(string *)((long)&encryption_key.field_2 + 8),
             &peVar8->id1,&local_178,(string *)local_148);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  std::__cxx11::string::~string((string *)local_148);
  std::__cxx11::string::~string((string *)(encryption_key.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(Perms.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(UE.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(OE.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(U.field_2._M_local_buf + 8));
  return;
}

Assistant:

void
QPDFWriter::setEncryptionParameters(
    char const* user_password,
    char const* owner_password,
    int V,
    int R,
    int key_len,
    std::set<int>& bits_to_clear)
{
    // PDF specification refers to bits with the low bit numbered 1.
    // We have to convert this into a bit field.

    // Specification always requires bits 1 and 2 to be cleared.
    bits_to_clear.insert(1);
    bits_to_clear.insert(2);

    if (R > 3) {
        // Bit 10 is deprecated and should always be set.  This used to mean accessibility.  There
        // is no way to disable accessibility with R > 3.
        bits_to_clear.erase(10);
    }

    int P = 0;
    // Create the complement of P, then invert.
    for (int b: bits_to_clear) {
        P |= (1 << (b - 1));
    }
    P = ~P;

    generateID();
    std::string O;
    std::string U;
    std::string OE;
    std::string UE;
    std::string Perms;
    std::string encryption_key;
    if (V < 5) {
        QPDF::compute_encryption_O_U(
            user_password, owner_password, V, R, key_len, P, m->encrypt_metadata, m->id1, O, U);
    } else {
        QPDF::compute_encryption_parameters_V5(
            user_password,
            owner_password,
            V,
            R,
            key_len,
            P,
            m->encrypt_metadata,
            m->id1,
            encryption_key,
            O,
            U,
            OE,
            UE,
            Perms);
    }
    setEncryptionParametersInternal(
        V, R, key_len, P, O, U, OE, UE, Perms, m->id1, user_password, encryption_key);
}